

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highs_c_api.cpp
# Opt level: O2

HighsInt Highs_passLinearObjectives
                   (void *highs,HighsInt num_linear_objective,double *weight,double *offset,
                   double *coefficients,double *abs_tolerance,double *rel_tolerance,
                   HighsInt *priority)

{
  uint uVar1;
  HighsStatus HVar2;
  ulong uVar3;
  double *__x;
  ulong uVar4;
  bool bVar5;
  HighsLinearObjective linear_objective;
  HighsLinearObjective local_70;
  
  HVar2 = Highs::clearLinearObjectives((Highs *)highs);
  if (HVar2 == kOk) {
    local_70.coefficients.super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_70.coefficients.super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_70.coefficients.super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    if (num_linear_objective < 1) {
      num_linear_objective = 0;
    }
    for (uVar4 = 0; HVar2 = kOk, uVar4 != (uint)num_linear_objective; uVar4 = uVar4 + 1) {
      uVar1 = *(uint *)((long)highs + 0x138);
      local_70.weight = weight[uVar4];
      local_70.offset = offset[uVar4];
      uVar3 = 0;
      if (0 < (int)uVar1) {
        uVar3 = (ulong)uVar1;
      }
      __x = coefficients + (int)(uVar1 * (HighsInt)uVar4);
      while (bVar5 = uVar3 != 0, uVar3 = uVar3 - 1, bVar5) {
        std::vector<double,_std::allocator<double>_>::push_back(&local_70.coefficients,__x);
        __x = __x + 1;
      }
      local_70.abs_tolerance = abs_tolerance[uVar4];
      local_70.rel_tolerance = rel_tolerance[uVar4];
      local_70.priority = priority[uVar4];
      local_70.weight = weight[uVar4];
      HVar2 = Highs::addLinearObjective((Highs *)highs,&local_70,(HighsInt)uVar4);
      if (HVar2 != kOk) break;
      if (local_70.coefficients.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_finish !=
          local_70.coefficients.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start) {
        local_70.coefficients.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_finish =
             local_70.coefficients.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
      }
    }
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
              (&local_70.coefficients.super__Vector_base<double,_std::allocator<double>_>);
  }
  return HVar2;
}

Assistant:

HighsInt Highs_passLinearObjectives(const void* highs,
                                    const HighsInt num_linear_objective,
                                    const double* weight, const double* offset,
                                    const double* coefficients,
                                    const double* abs_tolerance,
                                    const double* rel_tolerance,
                                    const HighsInt* priority) {
  HighsInt status = Highs_clearLinearObjectives(highs);
  if (status != kHighsStatusOk) return status;
  HighsLinearObjective linear_objective;
  for (HighsInt iObj = 0; iObj < num_linear_objective; iObj++) {
    HighsInt num_col = Highs_getNumCol(highs);
    linear_objective.weight = weight[iObj];
    linear_objective.offset = offset[iObj];
    for (HighsInt iCol = 0; iCol < num_col; iCol++)
      linear_objective.coefficients.push_back(
          coefficients[iObj * num_col + iCol]);
    linear_objective.abs_tolerance = abs_tolerance[iObj];
    linear_objective.rel_tolerance = rel_tolerance[iObj];
    linear_objective.priority = priority[iObj];
    linear_objective.weight = weight[iObj];
    status =
        HighsInt(((Highs*)highs)->addLinearObjective(linear_objective, iObj));
    if (status != kHighsStatusOk) return status;
    linear_objective.coefficients.clear();
  }
  return kHighsStatusOk;
}